

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutils.h
# Opt level: O2

void least_squares_accumulate(double *mat,double *y,double *a,double b,int n)

{
  ulong uVar1;
  ulong uVar2;
  int j;
  ulong uVar3;
  
  uVar2 = 0;
  uVar1 = 0;
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
  }
  for (; uVar2 != uVar1; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; (uint)n != uVar3; uVar3 = uVar3 + 1) {
      mat[uVar3] = a[uVar2] * a[uVar3] + mat[uVar3];
    }
    mat = mat + n;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    y[uVar2] = a[uVar2] * b + y[uVar2];
  }
  return;
}

Assistant:

static inline void least_squares_accumulate(double *mat, double *y,
                                            const double *a, double b, int n) {
  for (int i = 0; i < n; i++) {
    for (int j = 0; j < n; j++) {
      mat[i * n + j] += a[i] * a[j];
    }
  }
  for (int i = 0; i < n; i++) {
    y[i] += a[i] * b;
  }
}